

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O1

void __thiscall
QHttpNetworkConnectionPrivate::fillPipeline(QHttpNetworkConnectionPrivate *this,QIODevice *socket)

{
  ChannelState CVar1;
  qsizetype qVar2;
  ulong uVar3;
  int *piVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Operation OVar8;
  SocketState SVar9;
  QHttpNetworkConnectionChannel *pQVar10;
  long in_FS_OFFSET;
  bool bVar11;
  anon_class_1_0_00000001 getState;
  QString local_90;
  QString local_78;
  QString local_60;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->highPriorityQueue).d.size != 0) || ((this->lowPriorityQueue).d.size != 0)) {
    iVar7 = indexOf(this,socket);
    pQVar10 = this->channels;
    if ((pQVar10[iVar7].reply != (QHttpNetworkReply *)0x0) &&
       (((ulong)pQVar10[iVar7].alreadyPipelinedRequests.d.size < 2 &&
        (pQVar10[iVar7].pipeliningSupported == PipeliningProbablySupported)))) {
      bVar6 = QHttpNetworkRequest::isPipeliningAllowed(&pQVar10[iVar7].request);
      if (bVar6) {
        OVar8 = QHttpNetworkRequest::operation(&this->channels[iVar7].request);
        if (OVar8 == Get) {
          local_48.d.d._0_1_ = (anon_class_1_0_00000001)0xaa;
          SVar9 = QSocketAbstraction::
                  visit<QSocketAbstraction::socketState(QIODevice*)::_lambda(auto:1*)_1_&>
                            ((anon_class_1_0_00000001 *)&local_48,socket);
          if ((SVar9 == ConnectedState) && (this->channels[iVar7].resendCurrent == false)) {
            bVar6 = QAuthenticator::isNull(&this->channels[iVar7].authenticator);
            if (bVar6) {
              bVar5 = false;
              bVar11 = false;
            }
            else {
              QAuthenticator::user(&local_48,&this->channels[iVar7].authenticator);
              if (local_48.d.size == 0) {
                QAuthenticator::password(&local_60,&this->channels[iVar7].authenticator);
                bVar11 = local_60.d.size != 0;
                bVar5 = true;
              }
              else {
                bVar11 = true;
                bVar5 = false;
              }
            }
            if ((bVar5) && (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0)) {
              LOCK();
              ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((!bVar6) &&
               (piVar4 = (int *)CONCAT71(local_48.d.d._1_7_,local_48.d.d._0_1_),
               piVar4 != (int *)0x0)) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT71(local_48.d.d._1_7_,local_48.d.d._0_1_),2,0x10);
              }
            }
            if (!bVar11) {
              bVar6 = QAuthenticator::isNull(&this->channels[iVar7].proxyAuthenticator);
              if (bVar6) {
                bVar5 = false;
                bVar11 = false;
              }
              else {
                QAuthenticator::user(&local_78,&this->channels[iVar7].proxyAuthenticator);
                if (local_78.d.size == 0) {
                  QAuthenticator::password(&local_90,&this->channels[iVar7].proxyAuthenticator);
                  bVar11 = local_90.d.size != 0;
                  bVar5 = true;
                }
                else {
                  bVar11 = true;
                  bVar5 = false;
                }
              }
              if ((bVar5) && (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0)) {
                LOCK();
                ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((!bVar6) && (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0)) {
                LOCK();
                ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((!bVar11) &&
                 ((CVar1 = this->channels[iVar7].state, CVar1 == ReadingState ||
                  (CVar1 == WaitingState)))) {
                do {
                  if ((this->highPriorityQueue).d.size == 0) break;
                  qVar2 = this->channels[iVar7].alreadyPipelinedRequests.d.size;
                  fillPipeline(this,&this->highPriorityQueue,this->channels + iVar7);
                  pQVar10 = this->channels;
                  uVar3 = pQVar10[iVar7].alreadyPipelinedRequests.d.size;
                  if (2 < uVar3) goto LAB_002046a0;
                } while ((long)(int)qVar2 != uVar3);
                do {
                  if ((this->lowPriorityQueue).d.size == 0) break;
                  qVar2 = this->channels[iVar7].alreadyPipelinedRequests.d.size;
                  fillPipeline(this,&this->lowPriorityQueue,this->channels + iVar7);
                  pQVar10 = this->channels;
                  uVar3 = pQVar10[iVar7].alreadyPipelinedRequests.d.size;
                  if (2 < uVar3) goto LAB_002046a0;
                } while ((long)(int)qVar2 != uVar3);
                pQVar10 = this->channels;
LAB_002046a0:
                QHttpNetworkConnectionChannel::pipelineFlush
                          ((QHttpNetworkConnectionChannel *)(pQVar10 + iVar7));
              }
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionPrivate::fillPipeline(QIODevice *socket)
{
    // return fast if there is nothing to pipeline
    if (highPriorityQueue.isEmpty() && lowPriorityQueue.isEmpty())
        return;

    int i = indexOf(socket);

    // return fast if there was no reply right now processed
    if (channels[i].reply == nullptr)
        return;

    if (! (defaultPipelineLength - channels[i].alreadyPipelinedRequests.size() >= defaultRePipelineLength)) {
        return;
    }

    if (channels[i].pipeliningSupported != QHttpNetworkConnectionChannel::PipeliningProbablySupported)
        return;

    // the current request that is in must already support pipelining
    if (!channels[i].request.isPipeliningAllowed())
        return;

    // the current request must be a idempotent (right now we only check GET)
    if (channels[i].request.operation() != QHttpNetworkRequest::Get)
        return;

    // check if socket is connected
    if (QSocketAbstraction::socketState(socket) != QAbstractSocket::ConnectedState)
        return;

    // check for resendCurrent
    if (channels[i].resendCurrent)
        return;

    // we do not like authentication stuff
    // ### make sure to be OK with this in later releases
    if (!channels[i].authenticator.isNull()
        && (!channels[i].authenticator.user().isEmpty()
            || !channels[i].authenticator.password().isEmpty()))
        return;
    if (!channels[i].proxyAuthenticator.isNull()
        && (!channels[i].proxyAuthenticator.user().isEmpty()
            || !channels[i].proxyAuthenticator.password().isEmpty()))
        return;

    // must be in ReadingState or WaitingState
    if (! (channels[i].state == QHttpNetworkConnectionChannel::WaitingState
           || channels[i].state == QHttpNetworkConnectionChannel::ReadingState))
        return;

    int lengthBefore;
    while (!highPriorityQueue.isEmpty()) {
        lengthBefore = channels[i].alreadyPipelinedRequests.size();
        fillPipeline(highPriorityQueue, channels[i]);

        if (channels[i].alreadyPipelinedRequests.size() >= defaultPipelineLength) {
            channels[i].pipelineFlush();
            return;
        }

        if (lengthBefore == channels[i].alreadyPipelinedRequests.size())
            break; // did not process anything, now do the low prio queue
    }

    while (!lowPriorityQueue.isEmpty()) {
        lengthBefore = channels[i].alreadyPipelinedRequests.size();
        fillPipeline(lowPriorityQueue, channels[i]);

        if (channels[i].alreadyPipelinedRequests.size() >= defaultPipelineLength) {
            channels[i].pipelineFlush();
            return;
        }

        if (lengthBefore == channels[i].alreadyPipelinedRequests.size())
            break; // did not process anything
    }


    channels[i].pipelineFlush();
}